

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TFad<6,_double>,_3>::TPZManVector
          (TPZManVector<TFad<6,_double>,_3> *this,TPZManVector<TFad<6,_double>,_3> *copy)

{
  long lVar1;
  ulong *puVar2;
  TFad<6,_double> *pTVar3;
  TFad<6,_double> *pTVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  (this->super_TPZVec<TFad<6,_double>_>).fNAlloc = 0;
  (this->super_TPZVec<TFad<6,_double>_>).fStore = (TFad<6,_double> *)0x0;
  (this->super_TPZVec<TFad<6,_double>_>).fNElements = 0;
  (this->super_TPZVec<TFad<6,_double>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_016ad190;
  lVar1 = 0x28;
  do {
    *(undefined ***)((long)this->fExtAlloc[0].dx_ + lVar1 + -0x38) = &PTR__TFad_0166af08;
    *(undefined1 (*) [16])((long)this->fExtAlloc[0].dx_ + lVar1 + -0x30) = (undefined1  [16])0x0;
    *(undefined8 *)((long)this->fExtAlloc[0].dx_ + lVar1) = 0;
    *(undefined1 (*) [16])((long)this->fExtAlloc[0].dx_ + lVar1 + -0x20) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)this->fExtAlloc[0].dx_ + lVar1 + -0x10) = (undefined1  [16])0x0;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0xe8);
  uVar6 = (copy->super_TPZVec<TFad<6,_double>_>).fNElements;
  if ((long)uVar6 < 4) {
    pTVar3 = this->fExtAlloc;
    uVar5 = 0;
  }
  else {
    puVar2 = (ulong *)operator_new__(-(ulong)(uVar6 >> 0x3a != 0) | uVar6 * 0x40 | 8);
    *puVar2 = uVar6;
    pTVar3 = (TFad<6,_double> *)(puVar2 + 1);
    pTVar4 = pTVar3;
    do {
      (pTVar4->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
      pTVar4->val_ = 0.0;
      pTVar4->dx_[0] = 0.0;
      pTVar4->dx_[5] = 0.0;
      pTVar4->dx_[1] = 0.0;
      pTVar4->dx_[2] = 0.0;
      pTVar4->dx_[3] = 0.0;
      pTVar4->dx_[4] = 0.0;
      pTVar4 = pTVar4 + 1;
      uVar5 = uVar6;
    } while (pTVar4 != (TFad<6,_double> *)(puVar2 + uVar6 * 8 + 1));
  }
  (this->super_TPZVec<TFad<6,_double>_>).fStore = pTVar3;
  (this->super_TPZVec<TFad<6,_double>_>).fNElements = uVar6;
  (this->super_TPZVec<TFad<6,_double>_>).fNAlloc = uVar5;
  uVar5 = 0;
  if ((long)uVar6 < 1) {
    uVar6 = uVar5;
  }
  while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
    TFad<6,_double>::operator=
              ((TFad<6,_double> *)
               ((long)((this->super_TPZVec<TFad<6,_double>_>).fStore)->dx_ + (uVar5 - 0x10)),
               (TFad<6,_double> *)
               ((long)((copy->super_TPZVec<TFad<6,_double>_>).fStore)->dx_ + (uVar5 - 0x10)));
    uVar5 = uVar5 + 0x40;
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}